

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::NLBaseAssign<1>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,NLBaseAssign<1> *c,
               ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  char *str;
  ptrdiff_t _Num;
  
  pcVar4 = (c->super_BasicConstraint).name_._M_dataplus._M_p;
  sVar3 = strlen(pcVar4);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + sVar3;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  if (sVar3 != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar4,sVar3);
  }
  pBVar1->size_ = uVar5;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + 2;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  pcVar4 = pBVar1->ptr_;
  sVar2 = pBVar1->size_;
  (pcVar4 + sVar2)[0] = ':';
  (pcVar4 + sVar2)[1] = ' ';
  pBVar1->size_ = uVar5;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + 0x15;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_,"EXPLICIT ASSIGN var: ",0x15);
  pBVar1->size_ = uVar5;
  pcVar4 = ItemNamer::at(vnam,(long)c->bvar_);
  sVar3 = strlen(pcVar4);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + sVar3;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  if (sVar3 != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar4,sVar3);
  }
  pBVar1->size_ = uVar5;
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}